

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O2

PlainObject __thiscall
Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
          (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this)

{
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *in_RSI;
  RealScalar RVar1;
  undefined4 extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa;
  float fVar3;
  PlainObject PVar4;
  float local_34;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_30;
  undefined8 uVar2;
  
  RVar1 = squaredNorm(in_RSI);
  uVar2 = CONCAT44(extraout_XMM0_Db,RVar1);
  fVar3 = 0.0;
  if (RVar1 <= 0.0) {
    *(undefined4 *)(this + 8) = *(undefined4 *)(in_RSI + 8);
    *(undefined8 *)this = *(undefined8 *)in_RSI;
  }
  else {
    local_34 = SQRT(RVar1);
    MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator/
              (&local_30,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)in_RSI,&local_34);
    PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)this,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&local_30);
    uVar2 = extraout_XMM0_Qa;
  }
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar3;
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar2;
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)((ulong)uVar2 >> 0x20);
  return (PlainObject)
         PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

typename MatrixBase<Derived>::PlainObject
MatrixBase<Derived>::normalized() const
{
  typedef typename internal::nested_eval<Derived,2>::type _Nested;
  _Nested n(derived());
  RealScalar z = n.squaredNorm();
  // NOTE: after extensive benchmarking, this conditional does not impact performance, at least on recent x86 CPU
  if(z>RealScalar(0))
    return n / numext::sqrt(z);
  else
    return n;
}